

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_timestamp_ex(time_t time_data,char *buffer,int buffer_size,char *format)

{
  tm *__tp;
  long in_FS_OFFSET;
  time_t local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = time_data;
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
                 ,0x9d8,(uint)(0 < buffer_size),"buffer_size invalid");
  __tp = localtime(&local_30);
  strftime(buffer,(long)buffer_size,format,__tp);
  buffer[(long)buffer_size - 1] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void str_timestamp_ex(time_t time_data, char *buffer, int buffer_size, const char *format)
{
	struct tm *time_info;
	dbg_assert(buffer_size > 0, "buffer_size invalid");
	time_info = localtime(&time_data);
	strftime(buffer, buffer_size, format, time_info);
	buffer[buffer_size-1] = 0;	/* assure null termination */
}